

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

ON_Font * __thiscall
ON_FontList::FromPostScriptName
          (ON_FontList *this,wchar_t *postscript_name,Weight prefered_weight,
          Stretch prefered_stretch,Style prefered_style,bool bUnderlined,bool bStrikethrough)

{
  ON_Font *pOVar1;
  
  pOVar1 = Internal_FromNames(this,postscript_name,(wchar_t *)0x0,(wchar_t *)0x0,(wchar_t *)0x0,
                              prefered_weight,prefered_stretch,prefered_style,false,false,true,
                              bUnderlined,bStrikethrough,0.0);
  return pOVar1;
}

Assistant:

const ON_Font* ON_FontList::FromPostScriptName(
  const wchar_t* postscript_name,
  ON_Font::Weight prefered_weight,
  ON_Font::Stretch prefered_stretch,
  ON_Font::Style prefered_style,
  bool bUnderlined,
  bool bStrikethrough
) const
{
  return FromNames(
    postscript_name,
    nullptr,
    nullptr,
    nullptr,
    prefered_weight,
    prefered_stretch,
    prefered_style,
    false,
    false,
    bUnderlined,
    bStrikethrough,
    0.0
  );
}